

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Specific.hh
# Opt level: O2

void avro::
     codec_traits<std::vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>_>
     ::decode(Decoder *d,
             vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
             *s)

{
  long lVar1;
  bool bVar2;
  _union_array_union_Union__0__ t;
  _union_array_union_Union__0__ local_38;
  
  std::
  vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>::
  clear(s);
  lVar1 = (**(code **)(*(long *)d + 0x80))(d);
  while (lVar1 != 0) {
    while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
      local_38.idx_ = 0;
      local_38.value_.content = (placeholder *)0x0;
      codec_traits<uau::_union_array_union_Union__0__>::decode(d,&local_38);
      std::
      vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
      ::push_back(s,&local_38);
      if (local_38.value_.content != (placeholder *)0x0) {
        (*(local_38.value_.content)->_vptr_placeholder[1])();
      }
    }
    lVar1 = (**(code **)(*(long *)d + 0x88))(d);
  }
  return;
}

Assistant:

static void decode(Decoder& d, std::vector<T>& s) {
        s.clear();
        for (size_t n = d.arrayStart(); n != 0; n = d.arrayNext()) {
            for (size_t i = 0; i < n; ++i) {
                T t;
                avro::decode(d, t);
                s.push_back(t);
            }
        }
    }